

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jddctmgr.c
# Opt level: O1

void start_pass(j_decompress_ptr cinfo)

{
  double dVar1;
  jpeg_inverse_dct *pjVar2;
  JQUANT_TBL *pJVar3;
  void *pvVar4;
  inverse_DCT_method_ptr p_Var5;
  code *pcVar6;
  jpeg_error_mgr *pjVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int row;
  long lVar14;
  long lVar15;
  jpeg_component_info *pjVar16;
  
  if (0 < cinfo->num_components) {
    pjVar16 = cinfo->comp_info;
    pjVar2 = cinfo->idct;
    lVar15 = 0;
    p_Var5 = (inverse_DCT_method_ptr)0x0;
    uVar9 = 0;
    do {
      iVar8 = pjVar16->DCT_h_scaled_size;
      iVar11 = iVar8 * 0x100 + pjVar16->DCT_v_scaled_size;
      if (iVar11 < 0x70e) {
        if (0x403 < iVar11) {
          if (iVar11 < 0x603) {
            if (iVar11 < 0x505) {
              if (iVar11 == 0x404) {
                pcVar6 = jpeg_idct_4x4;
              }
              else {
                if (iVar11 != 0x408) goto LAB_002841a5;
                pcVar6 = jpeg_idct_4x8;
              }
            }
            else if (iVar11 == 0x505) {
              pcVar6 = jpeg_idct_5x5;
            }
            else {
              if (iVar11 != 0x50a) goto LAB_002841a5;
              pcVar6 = jpeg_idct_5x10;
            }
          }
          else if (iVar11 < 0x60c) {
            if (iVar11 == 0x603) {
              pcVar6 = jpeg_idct_6x3;
            }
            else {
              if (iVar11 != 0x606) goto LAB_002841a5;
              pcVar6 = jpeg_idct_6x6;
            }
          }
          else if (iVar11 == 0x60c) {
            pcVar6 = jpeg_idct_6x12;
          }
          else {
            if (iVar11 != 0x707) goto LAB_002841a5;
            pcVar6 = jpeg_idct_7x7;
          }
          goto LAB_002840b0;
        }
        if (0x203 < iVar11) {
          if (iVar11 < 0x306) {
            if (iVar11 == 0x204) {
              pcVar6 = jpeg_idct_2x4;
            }
            else {
              if (iVar11 != 0x303) goto LAB_002841a5;
              pcVar6 = jpeg_idct_3x3;
            }
          }
          else if (iVar11 == 0x306) {
            pcVar6 = jpeg_idct_3x6;
          }
          else {
            if (iVar11 != 0x402) goto LAB_002841a5;
            pcVar6 = jpeg_idct_4x2;
          }
          goto LAB_002840b0;
        }
        if (0x200 < iVar11) {
          if (iVar11 == 0x201) {
            pcVar6 = jpeg_idct_2x1;
          }
          else {
            if (iVar11 != 0x202) goto LAB_002841a5;
            pcVar6 = jpeg_idct_2x2;
          }
          goto LAB_002840b0;
        }
        pcVar6 = jpeg_idct_1x1;
        uVar10 = 0;
        if (iVar11 != 0x101) {
          if (iVar11 != 0x102) {
LAB_002841a5:
            pjVar7 = cinfo->err;
            pjVar7->msg_code = 7;
            (pjVar7->msg_parm).i[0] = iVar8;
            (cinfo->err->msg_parm).i[1] = pjVar16->DCT_v_scaled_size;
            pjVar7 = cinfo->err;
            goto LAB_002841cb;
          }
          pcVar6 = jpeg_idct_1x2;
          goto LAB_002840b0;
        }
      }
      else {
        if (iVar11 < 0xc06) {
          if (iVar11 < 0x909) {
            if (iVar11 < 0x808) {
              if (iVar11 == 0x70e) {
                pcVar6 = jpeg_idct_7x14;
              }
              else {
                if (iVar11 != 0x804) goto LAB_002841a5;
                pcVar6 = jpeg_idct_8x4;
              }
            }
            else {
              if (iVar11 == 0x808) {
                uVar10 = (ulong)cinfo->dct_method;
                if (uVar10 < 3) {
                  pcVar6 = (code *)(&PTR_jpeg_idct_islow_003b44e0)[uVar10];
                  goto LAB_002840b2;
                }
                pjVar7 = cinfo->err;
                pjVar7->msg_code = 0x31;
LAB_002841cb:
                (*pjVar7->error_exit)((j_common_ptr)cinfo);
                pcVar6 = p_Var5;
                uVar10 = uVar9;
                goto LAB_002840b2;
              }
              if (iVar11 != 0x810) goto LAB_002841a5;
              pcVar6 = jpeg_idct_8x16;
            }
          }
          else if (iVar11 < 0xa0a) {
            if (iVar11 == 0x909) {
              pcVar6 = jpeg_idct_9x9;
            }
            else {
              if (iVar11 != 0xa05) goto LAB_002841a5;
              pcVar6 = jpeg_idct_10x5;
            }
          }
          else if (iVar11 == 0xa0a) {
            pcVar6 = jpeg_idct_10x10;
          }
          else {
            if (iVar11 != 0xb0b) goto LAB_002841a5;
            pcVar6 = jpeg_idct_11x11;
          }
        }
        else if (iVar11 < 0xe0e) {
          if (iVar11 < 0xd0d) {
            if (iVar11 == 0xc06) {
              pcVar6 = jpeg_idct_12x6;
            }
            else {
              if (iVar11 != 0xc0c) goto LAB_002841a5;
              pcVar6 = jpeg_idct_12x12;
            }
          }
          else if (iVar11 == 0xd0d) {
            pcVar6 = jpeg_idct_13x13;
          }
          else {
            if (iVar11 != 0xe07) goto LAB_002841a5;
            pcVar6 = jpeg_idct_14x7;
          }
        }
        else if (iVar11 < 0x1008) {
          if (iVar11 == 0xe0e) {
            pcVar6 = jpeg_idct_14x14;
          }
          else {
            if (iVar11 != 0xf0f) goto LAB_002841a5;
            pcVar6 = jpeg_idct_15x15;
          }
        }
        else if (iVar11 == 0x1008) {
          pcVar6 = jpeg_idct_16x8;
        }
        else {
          if (iVar11 != 0x1010) goto LAB_002841a5;
          pcVar6 = jpeg_idct_16x16;
        }
LAB_002840b0:
        uVar10 = 0;
      }
LAB_002840b2:
      pjVar2->inverse_DCT[lVar15] = pcVar6;
      if (((pjVar16->component_needed != 0) &&
          (iVar8 = (int)uVar10, *(int *)((long)pjVar2[1].inverse_DCT + lVar15 * 4 + -8) != iVar8))
         && (pJVar3 = pjVar16->quant_table, pJVar3 != (JQUANT_TBL *)0x0)) {
        *(int *)((long)pjVar2[1].inverse_DCT + lVar15 * 4 + -8) = iVar8;
        pvVar4 = pjVar16->dct_table;
        if (iVar8 == 0) {
          lVar13 = 0;
          do {
            *(uint *)((long)pvVar4 + lVar13 * 4) = (uint)pJVar3->quantval[lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0x40);
        }
        else if (iVar8 == 1) {
          lVar13 = 0;
          do {
            *(int *)((long)pvVar4 + lVar13 * 2) =
                 (int)((long)*(short *)((long)start_pass::aanscales + lVar13) *
                       (ulong)*(ushort *)((long)pJVar3->quantval + lVar13) + 0x800 >> 0xc);
            lVar13 = lVar13 + 2;
          } while (lVar13 != 0x80);
        }
        else {
          lVar14 = 0;
          lVar13 = 0;
          do {
            dVar1 = start_pass::aanscalefactor[lVar14];
            lVar13 = (long)(int)lVar13;
            lVar12 = 0;
            do {
              *(float *)((long)pvVar4 + lVar13 * 4) =
                   (float)((double)pJVar3->quantval[lVar13] * dVar1 *
                           *(double *)((long)start_pass::aanscalefactor + lVar12) * 0.125);
              lVar13 = lVar13 + 1;
              lVar12 = lVar12 + 8;
            } while (lVar12 != 0x40);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 8);
        }
      }
      lVar15 = lVar15 + 1;
      pjVar16 = pjVar16 + 1;
      p_Var5 = pcVar6;
      uVar9 = uVar10;
    } while (lVar15 < cinfo->num_components);
  }
  return;
}

Assistant:

METHODDEF(void)
start_pass (j_decompress_ptr cinfo)
{
  my_idct_ptr idct = (my_idct_ptr) cinfo->idct;
  int ci, i;
  jpeg_component_info *compptr;
  int method = 0;
  inverse_DCT_method_ptr method_ptr = NULL;
  JQUANT_TBL * qtbl;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Select the proper IDCT routine for this component's scaling */
    switch ((compptr->DCT_h_scaled_size << 8) + compptr->DCT_v_scaled_size) {
#ifdef IDCT_SCALING_SUPPORTED
    case ((1 << 8) + 1):
      method_ptr = jpeg_idct_1x1;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((2 << 8) + 2):
      method_ptr = jpeg_idct_2x2;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((3 << 8) + 3):
      method_ptr = jpeg_idct_3x3;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((4 << 8) + 4):
      method_ptr = jpeg_idct_4x4;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((5 << 8) + 5):
      method_ptr = jpeg_idct_5x5;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((6 << 8) + 6):
      method_ptr = jpeg_idct_6x6;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((7 << 8) + 7):
      method_ptr = jpeg_idct_7x7;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((9 << 8) + 9):
      method_ptr = jpeg_idct_9x9;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((10 << 8) + 10):
      method_ptr = jpeg_idct_10x10;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((11 << 8) + 11):
      method_ptr = jpeg_idct_11x11;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((12 << 8) + 12):
      method_ptr = jpeg_idct_12x12;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((13 << 8) + 13):
      method_ptr = jpeg_idct_13x13;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((14 << 8) + 14):
      method_ptr = jpeg_idct_14x14;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((15 << 8) + 15):
      method_ptr = jpeg_idct_15x15;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((16 << 8) + 16):
      method_ptr = jpeg_idct_16x16;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((16 << 8) + 8):
      method_ptr = jpeg_idct_16x8;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((14 << 8) + 7):
      method_ptr = jpeg_idct_14x7;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((12 << 8) + 6):
      method_ptr = jpeg_idct_12x6;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((10 << 8) + 5):
      method_ptr = jpeg_idct_10x5;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((8 << 8) + 4):
      method_ptr = jpeg_idct_8x4;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((6 << 8) + 3):
      method_ptr = jpeg_idct_6x3;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((4 << 8) + 2):
      method_ptr = jpeg_idct_4x2;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((2 << 8) + 1):
      method_ptr = jpeg_idct_2x1;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((8 << 8) + 16):
      method_ptr = jpeg_idct_8x16;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((7 << 8) + 14):
      method_ptr = jpeg_idct_7x14;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((6 << 8) + 12):
      method_ptr = jpeg_idct_6x12;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((5 << 8) + 10):
      method_ptr = jpeg_idct_5x10;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((4 << 8) + 8):
      method_ptr = jpeg_idct_4x8;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((3 << 8) + 6):
      method_ptr = jpeg_idct_3x6;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((2 << 8) + 4):
      method_ptr = jpeg_idct_2x4;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((1 << 8) + 2):
      method_ptr = jpeg_idct_1x2;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
#endif
    case ((DCTSIZE << 8) + DCTSIZE):
      switch (cinfo->dct_method) {
#ifdef DCT_ISLOW_SUPPORTED
      case JDCT_ISLOW:
	method_ptr = jpeg_idct_islow;
	method = JDCT_ISLOW;
	break;
#endif
#ifdef DCT_IFAST_SUPPORTED
      case JDCT_IFAST:
	method_ptr = jpeg_idct_ifast;
	method = JDCT_IFAST;
	break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
      case JDCT_FLOAT:
	method_ptr = jpeg_idct_float;
	method = JDCT_FLOAT;
	break;
#endif
      default:
	ERREXIT(cinfo, JERR_NOT_COMPILED);
	break;
      }
      break;
    default:
      ERREXIT2(cinfo, JERR_BAD_DCTSIZE,
	       compptr->DCT_h_scaled_size, compptr->DCT_v_scaled_size);
      break;
    }
    idct->pub.inverse_DCT[ci] = method_ptr;
    /* Create multiplier table from quant table.
     * However, we can skip this if the component is uninteresting
     * or if we already built the table.  Also, if no quant table
     * has yet been saved for the component, we leave the
     * multiplier table all-zero; we'll be reading zeroes from the
     * coefficient controller's buffer anyway.
     */
    if (! compptr->component_needed || idct->cur_method[ci] == method)
      continue;
    qtbl = compptr->quant_table;
    if (qtbl == NULL)		/* happens if no data yet for component */
      continue;
    idct->cur_method[ci] = method;
    switch (method) {
#ifdef PROVIDE_ISLOW_TABLES
    case JDCT_ISLOW:
      {
	/* For LL&M IDCT method, multipliers are equal to raw quantization
	 * coefficients, but are stored as ints to ensure access efficiency.
	 */
	ISLOW_MULT_TYPE * ismtbl = (ISLOW_MULT_TYPE *) compptr->dct_table;
	for (i = 0; i < DCTSIZE2; i++) {
	  ismtbl[i] = (ISLOW_MULT_TYPE) qtbl->quantval[i];
	}
      }
      break;
#endif
#ifdef DCT_IFAST_SUPPORTED
    case JDCT_IFAST:
      {
	/* For AA&N IDCT method, multipliers are equal to quantization
	 * coefficients scaled by scalefactor[row]*scalefactor[col], where
	 *   scalefactor[0] = 1
	 *   scalefactor[k] = cos(k*PI/16) * sqrt(2)    for k=1..7
	 * For integer operation, the multiplier table is to be scaled by
	 * IFAST_SCALE_BITS.
	 */
	IFAST_MULT_TYPE * ifmtbl = (IFAST_MULT_TYPE *) compptr->dct_table;
#define CONST_BITS 14
	static const INT16 aanscales[DCTSIZE2] = {
	  /* precomputed values scaled up by 14 bits */
	  16384, 22725, 21407, 19266, 16384, 12873,  8867,  4520,
	  22725, 31521, 29692, 26722, 22725, 17855, 12299,  6270,
	  21407, 29692, 27969, 25172, 21407, 16819, 11585,  5906,
	  19266, 26722, 25172, 22654, 19266, 15137, 10426,  5315,
	  16384, 22725, 21407, 19266, 16384, 12873,  8867,  4520,
	  12873, 17855, 16819, 15137, 12873, 10114,  6967,  3552,
	   8867, 12299, 11585, 10426,  8867,  6967,  4799,  2446,
	   4520,  6270,  5906,  5315,  4520,  3552,  2446,  1247
	};
	SHIFT_TEMPS

	for (i = 0; i < DCTSIZE2; i++) {
	  ifmtbl[i] = (IFAST_MULT_TYPE)
	    DESCALE(MULTIPLY16V16((INT32) qtbl->quantval[i],
				  (INT32) aanscales[i]),
		    CONST_BITS-IFAST_SCALE_BITS);
	}
      }
      break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
    case JDCT_FLOAT:
      {
	/* For float AA&N IDCT method, multipliers are equal to quantization
	 * coefficients scaled by scalefactor[row]*scalefactor[col], where
	 *   scalefactor[0] = 1
	 *   scalefactor[k] = cos(k*PI/16) * sqrt(2)    for k=1..7
	 * We apply a further scale factor of 1/8.
	 */
	FLOAT_MULT_TYPE * fmtbl = (FLOAT_MULT_TYPE *) compptr->dct_table;
	int row, col;
	static const double aanscalefactor[DCTSIZE] = {
	  1.0, 1.387039845, 1.306562965, 1.175875602,
	  1.0, 0.785694958, 0.541196100, 0.275899379
	};

	i = 0;
	for (row = 0; row < DCTSIZE; row++) {
	  for (col = 0; col < DCTSIZE; col++) {
	    fmtbl[i] = (FLOAT_MULT_TYPE)
	      ((double) qtbl->quantval[i] *
	       aanscalefactor[row] * aanscalefactor[col] * 0.125);
	    i++;
	  }
	}
      }
      break;
#endif
    default:
      ERREXIT(cinfo, JERR_NOT_COMPILED);
      break;
    }
  }
}